

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

shared_ptr<peg::Ope> __thiscall
peg::seq<peg::Definition&,peg::Definition&,peg::Definition&,std::shared_ptr<peg::Ope>>
          (peg *this,Definition *args,Definition *args_1,Definition *args_2,
          shared_ptr<peg::Ope> *args_3)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<peg::Ope> sVar1;
  shared_ptr<peg::Ope> local_90;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  shared_ptr<peg::Ope> local_40;
  undefined8 local_30;
  shared_ptr<peg::Ope> *args_local_3;
  Definition *args_local_2;
  Definition *args_local_1;
  Definition *args_local;
  
  local_30 = args_3;
  args_local_3 = (shared_ptr<peg::Ope> *)args_2;
  args_local_2 = args_1;
  args_local_1 = args;
  args_local = (Definition *)this;
  Definition::operator_cast_to_shared_ptr((Definition *)(local_60 + 0x10));
  Definition::operator_cast_to_shared_ptr((Definition *)local_60);
  Definition::operator_cast_to_shared_ptr((Definition *)local_80);
  std::shared_ptr<peg::Ope>::shared_ptr(&local_90,(shared_ptr<peg::Ope> *)local_30);
  std::
  make_shared<peg::Sequence,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
            (&local_40,(shared_ptr<peg::Ope> *)(local_60 + 0x10),(shared_ptr<peg::Ope> *)local_60,
             (shared_ptr<peg::Ope> *)local_80);
  std::shared_ptr<peg::Ope>::shared_ptr<peg::Sequence,void>
            ((shared_ptr<peg::Ope> *)this,(shared_ptr<peg::Sequence> *)&local_40);
  std::shared_ptr<peg::Sequence>::~shared_ptr((shared_ptr<peg::Sequence> *)&local_40);
  std::shared_ptr<peg::Ope>::~shared_ptr(&local_90);
  std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)local_80);
  std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)local_60);
  std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)(local_60 + 0x10));
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<peg::Ope>)sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Ope> seq(Args&& ...args) {
    return std::make_shared<Sequence>(static_cast<std::shared_ptr<Ope>>(args)...);
}